

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageView.cpp
# Opt level: O0

void __thiscall myvk::ImageView::~ImageView(ImageView *this)

{
  PFN_vkDestroyImageView p_Var1;
  element_type *peVar2;
  element_type *this_00;
  VkDevice pVVar3;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ImageView_005308a8;
  p_Var1 = vkDestroyImageView;
  if (in_RDI[8] != 0) {
    peVar2 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2ce4b5);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    this_00 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2ce4d2);
    pVVar3 = Device::GetHandle(this_00);
    (*p_Var1)(pVVar3,(VkImageView)in_RDI[8],(VkAllocationCallbacks *)0x0);
  }
  std::shared_ptr<myvk::ImageBase>::~shared_ptr((shared_ptr<myvk::ImageBase> *)0x2ce50a);
  DeviceObjectBase::~DeviceObjectBase((DeviceObjectBase *)0x2ce514);
  return;
}

Assistant:

ImageView::~ImageView() {
	if (m_image_view)
		vkDestroyImageView(m_image_ptr->GetDevicePtr()->GetHandle(), m_image_view, nullptr);
}